

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O2

void writeObjectCode(char *filename,char *destdir,char *optEntryPoint,char *optMatchArch,
                    char *optFilename,char *outFilePath)

{
  uchar uVar1;
  int32_t iVar2;
  Elf32_Word EVar3;
  int iVar4;
  FileStream *pFVar5;
  size_t sVar6;
  ulong uVar7;
  FileStream *fileStream;
  ulong uVar8;
  uint len;
  char *pcVar9;
  Elf32_Sym *addr;
  Elf32_Half EVar10;
  bool bVar11;
  char entry [96];
  char buffer [4096];
  
  entry[0x50] = '\0';
  entry[0x51] = '\0';
  entry[0x52] = '\0';
  entry[0x53] = '\0';
  entry[0x54] = '\0';
  entry[0x55] = '\0';
  entry[0x56] = '\0';
  entry[0x57] = '\0';
  entry[0x58] = '\0';
  entry[0x59] = '\0';
  entry[0x5a] = '\0';
  entry[0x5b] = '\0';
  entry[0x5c] = '\0';
  entry[0x5d] = '\0';
  entry[0x5e] = '\0';
  entry[0x5f] = '\0';
  entry[0x40] = '\0';
  entry[0x41] = '\0';
  entry[0x42] = '\0';
  entry[0x43] = '\0';
  entry[0x44] = '\0';
  entry[0x45] = '\0';
  entry[0x46] = '\0';
  entry[0x47] = '\0';
  entry[0x48] = '\0';
  entry[0x49] = '\0';
  entry[0x4a] = '\0';
  entry[0x4b] = '\0';
  entry[0x4c] = '\0';
  entry[0x4d] = '\0';
  entry[0x4e] = '\0';
  entry[0x4f] = '\0';
  entry[0x30] = '\0';
  entry[0x31] = '\0';
  entry[0x32] = '\0';
  entry[0x33] = '\0';
  entry[0x34] = '\0';
  entry[0x35] = '\0';
  entry[0x36] = '\0';
  entry[0x37] = '\0';
  entry[0x38] = '\0';
  entry[0x39] = '\0';
  entry[0x3a] = '\0';
  entry[0x3b] = '\0';
  entry[0x3c] = '\0';
  entry[0x3d] = '\0';
  entry[0x3e] = '\0';
  entry[0x3f] = '\0';
  entry[0x20] = '\0';
  entry[0x21] = '\0';
  entry[0x22] = '\0';
  entry[0x23] = '\0';
  entry[0x24] = '\0';
  entry[0x25] = '\0';
  entry[0x26] = '\0';
  entry[0x27] = '\0';
  entry[0x28] = '\0';
  entry[0x29] = '\0';
  entry[0x2a] = '\0';
  entry[0x2b] = '\0';
  entry[0x2c] = '\0';
  entry[0x2d] = '\0';
  entry[0x2e] = '\0';
  entry[0x2f] = '\0';
  entry[0x10] = '\0';
  entry[0x11] = '\0';
  entry[0x12] = '\0';
  entry[0x13] = '\0';
  entry[0x14] = '\0';
  entry[0x15] = '\0';
  entry[0x16] = '\0';
  entry[0x17] = '\0';
  entry[0x18] = '\0';
  entry[0x19] = '\0';
  entry[0x1a] = '\0';
  entry[0x1b] = '\0';
  entry[0x1c] = '\0';
  entry[0x1d] = '\0';
  entry[0x1e] = '\0';
  entry[0x1f] = '\0';
  entry[0] = '\0';
  entry[1] = '\0';
  entry[2] = '\0';
  entry[3] = '\0';
  entry[4] = '\0';
  entry[5] = '\0';
  entry[6] = '\0';
  entry[7] = '\0';
  entry[8] = '\0';
  entry[9] = '\0';
  entry[10] = '\0';
  entry[0xb] = '\0';
  entry[0xc] = '\0';
  entry[0xd] = '\0';
  entry[0xe] = '\0';
  entry[0xf] = '\0';
  if (optMatchArch == (char *)0x0) {
    printf("genccode: using architecture cpu=%hu bits=%hu big-endian=%d\n",3,0x20,1);
    EVar10 = 3;
    bVar11 = true;
LAB_001f190b:
    pFVar5 = T_FileStream_open(filename,"rb");
    if (pFVar5 == (FileStream *)0x0) {
      pcVar9 = "genccode: unable to open input file %s\n";
    }
    else {
      EVar3 = T_FileStream_size(pFVar5);
      pcVar9 = entry + 1;
      getOutFilename(filename,destdir,buffer,pcVar9,".o",optFilename);
      if (outFilePath != (char *)0x0) {
        strcpy(outFilePath,buffer);
      }
      if (optEntryPoint != (char *)0x0) {
        strcpy(pcVar9,optEntryPoint);
        sVar6 = strlen(pcVar9);
        builtin_strncpy(entry + sVar6 + 1,"_dat",5);
      }
      sVar6 = strlen(pcVar9);
      uVar8 = 0;
      uVar7 = sVar6 & 0xffffffff;
      if ((int)sVar6 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        if (entry[uVar8 + 1] == '-') {
          entry[uVar8 + 1] = '_';
        }
      }
      fileStream = T_FileStream_open(buffer,"wb");
      if (fileStream == (FileStream *)0x0) {
        pcVar9 = "genccode: unable to open output file %s\n";
        filename = buffer;
      }
      else {
        len = 0;
        uVar1 = (optMatchArch == (char *)0x0) + '\x01';
        if (bVar11) {
          if ((writeObjectCode::sectionHeaders32[4].sh_offset & 0xf) == 0) {
            len = 0;
          }
          else {
            len = 0x10 - (writeObjectCode::sectionHeaders32[4].sh_offset & 0xf);
            writeObjectCode::sectionHeaders32[4].sh_offset =
                 writeObjectCode::sectionHeaders32[4].sh_offset + len;
          }
          addr = writeObjectCode::symbols32;
          writeObjectCode::header32.e_ident[5] = uVar1;
          writeObjectCode::header32.e_machine = EVar10;
          writeObjectCode::sectionHeaders32[4].sh_size = EVar3;
          writeObjectCode::symbols32[1].st_size = EVar3;
          T_FileStream_write(fileStream,&writeObjectCode::header32,0x34);
          T_FileStream_write(fileStream,writeObjectCode::sectionHeaders32,200);
          iVar2 = 0x20;
        }
        else {
          if ((writeObjectCode::sectionHeaders64[4].sh_offset & 0xf) != 0) {
            len = 0x10 - ((uint)writeObjectCode::sectionHeaders64[4].sh_offset & 0xf);
            writeObjectCode::sectionHeaders64[4].sh_offset =
                 writeObjectCode::sectionHeaders64[4].sh_offset + len;
          }
          writeObjectCode::sectionHeaders64[4].sh_size = (Elf64_Xword)(int)EVar3;
          writeObjectCode::header64.e_ident[5] = uVar1;
          writeObjectCode::header64.e_machine = EVar10;
          writeObjectCode::symbols64[1].st_size = writeObjectCode::sectionHeaders64[4].sh_size;
          T_FileStream_write(fileStream,&writeObjectCode::header64,0x40);
          T_FileStream_write(fileStream,writeObjectCode::sectionHeaders64,0x140);
          iVar2 = 0x30;
          addr = (Elf32_Sym *)writeObjectCode::symbols64;
        }
        T_FileStream_write(fileStream,addr,iVar2);
        T_FileStream_write(fileStream,"",0x28);
        T_FileStream_write(fileStream,entry,0x60);
        if (len != 0) {
          T_FileStream_write(fileStream,"",len);
        }
        while (iVar2 = T_FileStream_read(pFVar5,buffer,0x1000), iVar2 != 0) {
          T_FileStream_write(fileStream,buffer,iVar2);
        }
        iVar4 = T_FileStream_error(pFVar5);
        if (iVar4 == 0) {
          iVar4 = T_FileStream_error(fileStream);
          if (iVar4 == 0) {
            T_FileStream_close(fileStream);
            T_FileStream_close(pFVar5);
            return;
          }
          pcVar9 = "genccode: file write error while generating from file %s\n";
        }
        else {
          pcVar9 = "genccode: file read error while generating from file %s\n";
        }
      }
    }
  }
  else {
    pFVar5 = T_FileStream_open(optMatchArch,"rb");
    if (pFVar5 != (FileStream *)0x0) {
      iVar2 = T_FileStream_read(pFVar5,buffer,0x800);
      if (iVar2 < 0x34) {
        pcVar9 = "genccode: match-arch file %s is too short\n";
LAB_001f1c18:
        fprintf(_stderr,pcVar9,optMatchArch);
      }
      else {
        if ((buffer._0_4_ != 0x464c457f) || ((byte)(buffer[4] - 3U) < 0xfe)) {
          pcVar9 = "genccode: match-arch file %s is not an ELF object file, or not supported\n";
          goto LAB_001f1c18;
        }
        if (buffer[5] != '\x02') {
          bVar11 = buffer[4] == '\x01';
          T_FileStream_close(pFVar5);
          printf("genccode: --match-arch cpu=%hu bits=%hu big-endian=%d\n",
                 (ulong)(ushort)buffer._18_2_,(ulong)((uint)!bVar11 * 0x20 + 0x20),0);
          EVar10 = buffer._18_2_;
          goto LAB_001f190b;
        }
        fwrite("genccode: currently only same-endianness ELF formats are supported\n",0x43,1,_stderr
              );
      }
      iVar4 = 0x10;
      goto LAB_001f1c42;
    }
    pcVar9 = "genccode: unable to open match-arch file %s\n";
    filename = optMatchArch;
  }
  fprintf(_stderr,pcVar9,filename);
  iVar4 = 4;
LAB_001f1c42:
  exit(iVar4);
}

Assistant:

U_CAPI void U_EXPORT2
writeObjectCode(const char *filename, const char *destdir, const char *optEntryPoint, const char *optMatchArch, const char *optFilename, char *outFilePath) {
    /* common variables */
    char buffer[4096], entry[96]={ 0 };
    FileStream *in, *out;
    const char *newSuffix;
    int32_t i, entryLength, length, size, entryOffset=0, entryLengthOffset=0;

    uint16_t cpu, bits;
    UBool makeBigEndian;

    /* platform-specific variables and initialization code */
#ifdef U_ELF
    /* 32-bit Elf file header */
    static Elf32_Ehdr header32={
        {
            /* e_ident[] */
            ELFMAG0, ELFMAG1, ELFMAG2, ELFMAG3,
            ELFCLASS32,
            U_IS_BIG_ENDIAN ? ELFDATA2MSB : ELFDATA2LSB,
            EV_CURRENT /* EI_VERSION */
        },
        ET_REL,
        EM_386,
        EV_CURRENT, /* e_version */
        0, /* e_entry */
        0, /* e_phoff */
        (Elf32_Off)sizeof(Elf32_Ehdr), /* e_shoff */
        0, /* e_flags */
        (Elf32_Half)sizeof(Elf32_Ehdr), /* eh_size */
        0, /* e_phentsize */
        0, /* e_phnum */
        (Elf32_Half)sizeof(Elf32_Shdr), /* e_shentsize */
        5, /* e_shnum */
        2 /* e_shstrndx */
    };

    /* 32-bit Elf section header table */
    static Elf32_Shdr sectionHeaders32[5]={
        { /* SHN_UNDEF */
            0, 0, 0, 0, 0, 0, 0, 0, 0, 0
        },
        { /* .symtab */
            1, /* sh_name */
            SHT_SYMTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)), /* sh_offset */
            (Elf32_Word)(2*sizeof(Elf32_Sym)), /* sh_size */
            3, /* sh_link=sect hdr index of .strtab */
            1, /* sh_info=One greater than the symbol table index of the last
                * local symbol (with STB_LOCAL). */
            4, /* sh_addralign */
            (Elf32_Word)(sizeof(Elf32_Sym)) /* sh_entsize */
        },
        { /* .shstrtab */
            9, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)), /* sh_offset */
            40, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .strtab */
            19, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)+40), /* sh_offset */
            (Elf32_Word)sizeof(entry), /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .rodata */
            27, /* sh_name */
            SHT_PROGBITS,
            SHF_ALLOC, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)+40+sizeof(entry)), /* sh_offset */
            0, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            16, /* sh_addralign */
            0 /* sh_entsize */
        }
    };

    /* symbol table */
    static Elf32_Sym symbols32[2]={
        { /* STN_UNDEF */
            0, 0, 0, 0, 0, 0
        },
        { /* data entry point */
            1, /* st_name */
            0, /* st_value */
            0, /* st_size */
            ELF64_ST_INFO(STB_GLOBAL, STT_OBJECT),
            0, /* st_other */
            4 /* st_shndx=index of related section table entry */
        }
    };

    /* section header string table, with decimal string offsets */
    static const char sectionStrings[40]=
        /*  0 */ "\0"
        /*  1 */ ".symtab\0"
        /*  9 */ ".shstrtab\0"
        /* 19 */ ".strtab\0"
        /* 27 */ ".rodata\0"
        /* 35 */ "\0\0\0\0"; /* contains terminating NUL */
        /* 40: padded to multiple of 8 bytes */

    /*
     * Use entry[] for the string table which will contain only the
     * entry point name.
     * entry[0] must be 0 (NUL)
     * The entry point name can be up to 38 characters long (sizeof(entry)-2).
     */

    /* 16-align .rodata in the .o file, just in case */
    static const char padding[16]={ 0 };
    int32_t paddingSize;

#ifdef U_ELF64
    /* 64-bit Elf file header */
    static Elf64_Ehdr header64={
        {
            /* e_ident[] */
            ELFMAG0, ELFMAG1, ELFMAG2, ELFMAG3,
            ELFCLASS64,
            U_IS_BIG_ENDIAN ? ELFDATA2MSB : ELFDATA2LSB,
            EV_CURRENT /* EI_VERSION */
        },
        ET_REL,
        EM_X86_64,
        EV_CURRENT, /* e_version */
        0, /* e_entry */
        0, /* e_phoff */
        (Elf64_Off)sizeof(Elf64_Ehdr), /* e_shoff */
        0, /* e_flags */
        (Elf64_Half)sizeof(Elf64_Ehdr), /* eh_size */
        0, /* e_phentsize */
        0, /* e_phnum */
        (Elf64_Half)sizeof(Elf64_Shdr), /* e_shentsize */
        5, /* e_shnum */
        2 /* e_shstrndx */
    };

    /* 64-bit Elf section header table */
    static Elf64_Shdr sectionHeaders64[5]={
        { /* SHN_UNDEF */
            0, 0, 0, 0, 0, 0, 0, 0, 0, 0
        },
        { /* .symtab */
            1, /* sh_name */
            SHT_SYMTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)), /* sh_offset */
            (Elf64_Xword)(2*sizeof(Elf64_Sym)), /* sh_size */
            3, /* sh_link=sect hdr index of .strtab */
            1, /* sh_info=One greater than the symbol table index of the last
                * local symbol (with STB_LOCAL). */
            4, /* sh_addralign */
            (Elf64_Xword)(sizeof(Elf64_Sym)) /* sh_entsize */
        },
        { /* .shstrtab */
            9, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)), /* sh_offset */
            40, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .strtab */
            19, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)+40), /* sh_offset */
            (Elf64_Xword)sizeof(entry), /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .rodata */
            27, /* sh_name */
            SHT_PROGBITS,
            SHF_ALLOC, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)+40+sizeof(entry)), /* sh_offset */
            0, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            16, /* sh_addralign */
            0 /* sh_entsize */
        }
    };

    /*
     * 64-bit symbol table
     * careful: different order of items compared with Elf32_sym!
     */
    static Elf64_Sym symbols64[2]={
        { /* STN_UNDEF */
            0, 0, 0, 0, 0, 0
        },
        { /* data entry point */
            1, /* st_name */
            ELF64_ST_INFO(STB_GLOBAL, STT_OBJECT),
            0, /* st_other */
            4, /* st_shndx=index of related section table entry */
            0, /* st_value */
            0 /* st_size */
        }
    };

#endif /* U_ELF64 */

    /* entry[] have a leading NUL */
    entryOffset=1;

    /* in the common code, count entryLength from after the NUL */
    entryLengthOffset=1;

    newSuffix=".o";

#elif U_PLATFORM_HAS_WIN32_API
    struct {
        IMAGE_FILE_HEADER fileHeader;
        IMAGE_SECTION_HEADER sections[2];
        char linkerOptions[100];
    } objHeader;
    IMAGE_SYMBOL symbols[1];
    struct {
        DWORD sizeofLongNames;
        char longNames[100];
    } symbolNames;

    /*
     * entry sometimes have a leading '_'
     * overwritten if entryOffset==0 depending on the target platform
     * see check for cpu below
     */
    entry[0]='_';

    newSuffix=".obj";
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    /* deal with options, files and the entry point name */
    getArchitecture(&cpu, &bits, &makeBigEndian, optMatchArch);
    if (optMatchArch)
    {
        printf("genccode: --match-arch cpu=%hu bits=%hu big-endian=%d\n", cpu, bits, makeBigEndian);
    }
    else
    {
        printf("genccode: using architecture cpu=%hu bits=%hu big-endian=%d\n", cpu, bits, makeBigEndian);
    }
#if U_PLATFORM_HAS_WIN32_API
    if(cpu==IMAGE_FILE_MACHINE_I386) {
        entryOffset=1;
    }
#endif

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open input file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }
    size=T_FileStream_size(in);

    getOutFilename(filename, destdir, buffer, entry+entryOffset, newSuffix, optFilename);
    if (outFilePath != NULL) {
        uprv_strcpy(outFilePath, buffer);
    }

    if(optEntryPoint != NULL) {
        uprv_strcpy(entry+entryOffset, optEntryPoint);
        uprv_strcat(entry+entryOffset, "_dat");
    }
    /* turn dashes in the entry name into underscores */
    entryLength=(int32_t)uprv_strlen(entry+entryLengthOffset);
    for(i=0; i<entryLength; ++i) {
        if(entry[entryLengthOffset+i]=='-') {
            entry[entryLengthOffset+i]='_';
        }
    }

    /* open the output file */
    out=T_FileStream_open(buffer, "wb");
    if(out==NULL) {
        fprintf(stderr, "genccode: unable to open output file %s\n", buffer);
        exit(U_FILE_ACCESS_ERROR);
    }

#ifdef U_ELF
    if(bits==32) {
        header32.e_ident[EI_DATA]= makeBigEndian ? ELFDATA2MSB : ELFDATA2LSB;
        header32.e_machine=cpu;

        /* 16-align .rodata in the .o file, just in case */
        paddingSize=sectionHeaders32[4].sh_offset & 0xf;
        if(paddingSize!=0) {
                paddingSize=0x10-paddingSize;
                sectionHeaders32[4].sh_offset+=paddingSize;
        }

        sectionHeaders32[4].sh_size=(Elf32_Word)size;

        symbols32[1].st_size=(Elf32_Word)size;

        /* write .o headers */
        T_FileStream_write(out, &header32, (int32_t)sizeof(header32));
        T_FileStream_write(out, sectionHeaders32, (int32_t)sizeof(sectionHeaders32));
        T_FileStream_write(out, symbols32, (int32_t)sizeof(symbols32));
    } else /* bits==64 */ {
#ifdef U_ELF64
        header64.e_ident[EI_DATA]= makeBigEndian ? ELFDATA2MSB : ELFDATA2LSB;
        header64.e_machine=cpu;

        /* 16-align .rodata in the .o file, just in case */
        paddingSize=sectionHeaders64[4].sh_offset & 0xf;
        if(paddingSize!=0) {
                paddingSize=0x10-paddingSize;
                sectionHeaders64[4].sh_offset+=paddingSize;
        }

        sectionHeaders64[4].sh_size=(Elf64_Xword)size;

        symbols64[1].st_size=(Elf64_Xword)size;

        /* write .o headers */
        T_FileStream_write(out, &header64, (int32_t)sizeof(header64));
        T_FileStream_write(out, sectionHeaders64, (int32_t)sizeof(sectionHeaders64));
        T_FileStream_write(out, symbols64, (int32_t)sizeof(symbols64));
#endif
    }

    T_FileStream_write(out, sectionStrings, (int32_t)sizeof(sectionStrings));
    T_FileStream_write(out, entry, (int32_t)sizeof(entry));
    if(paddingSize!=0) {
        T_FileStream_write(out, padding, paddingSize);
    }
#elif U_PLATFORM_HAS_WIN32_API
    /* populate the .obj headers */
    uprv_memset(&objHeader, 0, sizeof(objHeader));
    uprv_memset(&symbols, 0, sizeof(symbols));
    uprv_memset(&symbolNames, 0, sizeof(symbolNames));

    /* write the linker export directive */
    uprv_strcpy(objHeader.linkerOptions, "-export:");
    length=8;
    uprv_strcpy(objHeader.linkerOptions+length, entry);
    length+=entryLength;
    uprv_strcpy(objHeader.linkerOptions+length, ",data ");
    length+=6;

    /* set the file header */
    objHeader.fileHeader.Machine=cpu;
    objHeader.fileHeader.NumberOfSections=2;
    objHeader.fileHeader.TimeDateStamp=(DWORD)time(NULL);
    objHeader.fileHeader.PointerToSymbolTable=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER+length+size; /* start of symbol table */
    objHeader.fileHeader.NumberOfSymbols=1;

    /* set the section for the linker options */
    uprv_strncpy((char *)objHeader.sections[0].Name, ".drectve", 8);
    objHeader.sections[0].SizeOfRawData=length;
    objHeader.sections[0].PointerToRawData=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER;
    objHeader.sections[0].Characteristics=IMAGE_SCN_LNK_INFO|IMAGE_SCN_LNK_REMOVE|IMAGE_SCN_ALIGN_1BYTES;

    /* set the data section */
    uprv_strncpy((char *)objHeader.sections[1].Name, ".rdata", 6);
    objHeader.sections[1].SizeOfRawData=size;
    objHeader.sections[1].PointerToRawData=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER+length;
    objHeader.sections[1].Characteristics=IMAGE_SCN_CNT_INITIALIZED_DATA|IMAGE_SCN_ALIGN_16BYTES|IMAGE_SCN_MEM_READ;

    /* set the symbol table */
    if(entryLength<=8) {
        uprv_strncpy((char *)symbols[0].N.ShortName, entry, entryLength);
        symbolNames.sizeofLongNames=4;
    } else {
        symbols[0].N.Name.Short=0;
        symbols[0].N.Name.Long=4;
        symbolNames.sizeofLongNames=4+entryLength+1;
        uprv_strcpy(symbolNames.longNames, entry);
    }
    symbols[0].SectionNumber=2;
    symbols[0].StorageClass=IMAGE_SYM_CLASS_EXTERNAL;

    /* write the file header and the linker options section */
    T_FileStream_write(out, &objHeader, objHeader.sections[1].PointerToRawData);
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    /* copy the data file into section 2 */
    for(;;) {
        length=T_FileStream_read(in, buffer, sizeof(buffer));
        if(length==0) {
            break;
        }
        T_FileStream_write(out, buffer, (int32_t)length);
    }

#if U_PLATFORM_HAS_WIN32_API
    /* write the symbol table */
    T_FileStream_write(out, symbols, IMAGE_SIZEOF_SYMBOL);
    T_FileStream_write(out, &symbolNames, symbolNames.sizeofLongNames);
#endif

    if(T_FileStream_error(in)) {
        fprintf(stderr, "genccode: file read error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    if(T_FileStream_error(out)) {
        fprintf(stderr, "genccode: file write error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    T_FileStream_close(out);
    T_FileStream_close(in);
}